

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readNumber(OurReader *this,bool checkInf)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  
  pbVar1 = (byte *)this->end_;
  pbVar2 = (byte *)this->current_;
  if ((checkInf && pbVar2 != pbVar1) && (*pbVar2 == 0x49)) {
    this->current_ = (Location)(pbVar2 + 1);
    return false;
  }
  do {
    pbVar3 = pbVar2;
    this->current_ = (Location)pbVar3;
    if (pbVar1 <= pbVar3) {
      return true;
    }
    bVar4 = *pbVar3;
    pbVar2 = pbVar3 + 1;
  } while ((byte)(bVar4 - 0x30) < 10);
  if (bVar4 == 0x2e) {
    this->current_ = (Location)pbVar2;
    if (pbVar1 <= pbVar2) {
      return true;
    }
    bVar4 = *pbVar2;
    pbVar2 = pbVar3 + 2;
    while ((byte)(bVar4 - 0x30) < 10) {
      this->current_ = (Location)pbVar2;
      if (pbVar1 <= pbVar2) {
        return true;
      }
      bVar4 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    }
  }
  if (((bVar4 & 0xdf) == 0x45) && (this->current_ = (Location)pbVar2, pbVar2 < pbVar1)) {
    pbVar3 = pbVar2 + 1;
    bVar4 = *pbVar2;
    if ((bVar4 == 0x2d) || (bVar4 == 0x2b)) {
      this->current_ = (Location)pbVar3;
      if (pbVar1 <= pbVar3) {
        return true;
      }
      bVar4 = pbVar2[1];
      pbVar3 = pbVar2 + 2;
    }
    for (; ((byte)(bVar4 - 0x30) < 10 && (this->current_ = (Location)pbVar3, pbVar3 < pbVar1));
        pbVar3 = pbVar3 + 1) {
      bVar4 = *pbVar3;
    }
  }
  return true;
}

Assistant:

bool OurReader::readNumber(bool checkInf) {
  const char *p = current_;
  if (checkInf && p != end_ && *p == 'I') {
    current_ = ++p;
    return false;
  }
  char c = '0'; // stopgap for already consumed character
  // integral part
  while (c >= '0' && c <= '9')
    c = (current_ = p) < end_ ? *p++ : '\0';
  // fractional part
  if (c == '.') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  // exponential part
  if (c == 'e' || c == 'E') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    if (c == '+' || c == '-')
      c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  return true;
}